

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O1

void __thiscall booster::bad_callback_call::bad_callback_call(bad_callback_call *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"bad_callback_call","");
  runtime_error::runtime_error(&this->super_runtime_error,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  *(undefined ***)&this->super_runtime_error = &PTR__runtime_error_001cfee8;
  (this->super_runtime_error).super_backtrace._vptr_backtrace =
       (_func_int **)&PTR__bad_callback_call_001cff10;
  return;
}

Assistant:

bad_callback_call() : 
			booster::runtime_error("bad_callback_call")
		{
		}